

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_ServiceMethodPrimitiveParams_Test::
~ParseErrorTest_ServiceMethodPrimitiveParams_Test
          (ParseErrorTest_ServiceMethodPrimitiveParams_Test *this)

{
  ParseErrorTest_ServiceMethodPrimitiveParams_Test *this_local;
  
  ~ParseErrorTest_ServiceMethodPrimitiveParams_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, ServiceMethodPrimitiveParams) {
  ExpectHasErrors(
      "service TestService {\n"
      "  rpc Foo(int32) returns (string);\n"
      "}\n",
      "1:10: Expected message type.\n"
      "1:26: Expected message type.\n");
}